

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pseudo-types.cpp
# Opt level: O3

string * yactfr::internal::pseudoTypeIdenStr<yactfr::internal::PseudoDst>
                   (string *__return_storage_ptr__,PseudoDst *pseudoDst)

{
  ostream *poVar1;
  ostringstream ss;
  char local_191;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<unsigned_long_long>((ulonglong)local_190);
  if (((pseudoDst->_name).super_type.m_initialized != false) ||
     ((pseudoDst->_ns).super_type.m_initialized == true)) {
    local_191 = '(';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,&local_191,1);
    if ((pseudoDst->_name).super_type.m_initialized == true) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"named `",7);
      if ((pseudoDst->_name).super_type.m_initialized == false) goto LAB_0023aadc;
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,
                          (char *)(pseudoDst->_name).super_type.m_storage.dummy_.aligner_,
                          *(long *)((long)&(pseudoDst->_name).super_type.m_storage.dummy_ + 8));
      local_191 = '`';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_191,1);
      if ((pseudoDst->_ns).super_type.m_initialized == true) {
        local_191 = ' ';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,&local_191,1);
      }
    }
    if ((pseudoDst->_ns).super_type.m_initialized == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_190,"within namespace `",0x12);
      if ((pseudoDst->_ns).super_type.m_initialized == false) {
LAB_0023aadc:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,
                      "reference_const_type boost::optional<std::basic_string<char>>::get() const [T = std::basic_string<char>]"
                     );
      }
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_190,
                          (char *)(pseudoDst->_ns).super_type.m_storage.dummy_.aligner_,
                          *(long *)((long)&(pseudoDst->_ns).super_type.m_storage.dummy_ + 8));
      local_191 = '`';
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_191,1);
    }
    local_191 = ')';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,&local_191,1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string pseudoTypeIdenStr(const PseudoTypeT& pseudoDst)
{
    std::ostringstream ss;

    ss << pseudoDst.id();

    if (pseudoDst.name() || pseudoDst.ns()) {
        ss << '(';

        if (pseudoDst.name()) {
            ss << "named `" << *pseudoDst.name() << '`';

            if (pseudoDst.ns()) {
                ss << ' ';
            }
        }

        if (pseudoDst.ns()) {
            ss << "within namespace `" << *pseudoDst.ns() << '`';
        }

        ss << ')';
    }

    return ss.str();
}